

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringRef.cpp
# Opt level: O0

void __thiscall
llvm::StringRef::split
          (StringRef *this,SmallVectorImpl<llvm::StringRef> *A,StringRef Separator,int MaxSplit,
          bool KeepEmpty)

{
  StringRef Str;
  unsigned_long *puVar1;
  int iVar2;
  bool bVar3;
  StringRef local_f8;
  StringRef *local_e8;
  char *local_e0;
  size_t local_d8;
  size_t Idx;
  StringRef S;
  bool KeepEmpty_local;
  int MaxSplit_local;
  SmallVectorImpl<llvm::StringRef> *A_local;
  StringRef *this_local;
  StringRef Separator_local;
  unsigned_long local_90;
  char *local_88;
  size_t *local_80;
  undefined1 local_78 [16];
  size_t local_68;
  unsigned_long local_60;
  size_t *local_58;
  undefined1 local_50 [16];
  size_t *local_40;
  size_t local_38;
  char *local_30;
  undefined1 *local_28;
  char *local_20;
  char *local_18;
  undefined1 *local_10;
  
  Separator_local.Data = (char *)Separator.Length;
  this_local = (StringRef *)Separator.Data;
  Idx = (size_t)this->Data;
  S.Data = (char *)this->Length;
  S.Length._3_1_ = KeepEmpty;
  S.Length._4_4_ = MaxSplit;
  while (iVar2 = S.Length._4_4_ + -1, bVar3 = S.Length._4_4_ != 0, S.Length._4_4_ = iVar2, bVar3) {
    local_e8 = this_local;
    local_e0 = Separator_local.Data;
    Str.Length = (size_t)Separator_local.Data;
    Str.Data = (char *)this_local;
    local_d8 = find((StringRef *)&Idx,Str,0);
    if (local_d8 == 0xffffffffffffffff) break;
    if (((S.Length._3_1_ & 1) != 0) || (local_d8 != 0)) {
      local_58 = &Idx;
      local_60 = 0;
      local_68 = local_d8;
      puVar1 = std::min<unsigned_long>(&local_60,(unsigned_long *)&S);
      local_60 = *puVar1;
      puVar1 = std::max<unsigned_long>(&local_60,&local_68);
      puVar1 = std::min<unsigned_long>(puVar1,(unsigned_long *)&S);
      local_68 = *puVar1;
      local_f8.Data = (char *)(Idx + local_60);
      local_f8.Length = local_68 - local_60;
      local_28 = local_50;
      local_38 = local_f8.Length;
      local_30 = local_f8.Data;
      SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
                (&A->super_SmallVectorTemplateBase<llvm::StringRef,_true>,&local_f8);
    }
    Separator_local.Length = (size_t)&this_local;
    local_88 = Separator_local.Data + local_d8;
    local_80 = &Idx;
    local_90 = 0xffffffffffffffff;
    puVar1 = std::min<unsigned_long>((unsigned_long *)&local_88,(unsigned_long *)&S);
    local_88 = (char *)*puVar1;
    puVar1 = std::max<unsigned_long>((unsigned_long *)&local_88,&local_90);
    puVar1 = std::min<unsigned_long>(puVar1,(unsigned_long *)&S);
    local_90 = *puVar1;
    Idx = (size_t)(local_88 + Idx);
    S.Data = (char *)(local_90 - (long)local_88);
    local_10 = local_78;
    local_20 = S.Data;
    local_18 = (char *)Idx;
  }
  if (((S.Length._3_1_ & 1) != 0) || (local_40 = &Idx, S.Data != (char *)0x0)) {
    SmallVectorTemplateBase<llvm::StringRef,_true>::push_back
              (&A->super_SmallVectorTemplateBase<llvm::StringRef,_true>,(StringRef *)&Idx);
  }
  return;
}

Assistant:

void StringRef::split(SmallVectorImpl<StringRef> &A,
                      StringRef Separator, int MaxSplit,
                      bool KeepEmpty) const {
  StringRef S = *this;

  // Count down from MaxSplit. When MaxSplit is -1, this will just split
  // "forever". This doesn't support splitting more than 2^31 times
  // intentionally; if we ever want that we can make MaxSplit a 64-bit integer
  // but that seems unlikely to be useful.
  while (MaxSplit-- != 0) {
    size_t Idx = S.find(Separator);
    if (Idx == npos)
      break;

    // Push this split.
    if (KeepEmpty || Idx > 0)
      A.push_back(S.slice(0, Idx));

    // Jump forward.
    S = S.slice(Idx + Separator.size(), npos);
  }

  // Push the tail.
  if (KeepEmpty || !S.empty())
    A.push_back(S);
}